

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtbl.c
# Opt level: O2

cf_void_t cf_hashtbl_set(cf_hashtbl_t *self,cf_void_t *key,cf_size_t len,cf_void_t *value)

{
  byte bVar1;
  hashtbl_node_t *__ptr;
  int iVar2;
  cf_size_t cVar3;
  hashtbl_node **pphVar4;
  hashtbl_node_t *phVar5;
  hashtbl_node **pphVar6;
  uint uVar7;
  
  if (value != (cf_void_t *)0x0) {
    phVar5 = hashtbl_get_node(self,key,len,1);
    if (phVar5 != (hashtbl_node_t *)0x0) {
      phVar5->value = value;
    }
    return;
  }
  if (len == 0xffffffffffffffff) {
    uVar7 = 0;
    for (len = 1; bVar1 = *(byte *)((long)key + (len - 1)), bVar1 != 0; len = len + 1) {
      uVar7 = uVar7 * 0x21 + (uint)bVar1;
    }
  }
  else {
    uVar7 = 0;
    for (cVar3 = 0; len != cVar3; cVar3 = cVar3 + 1) {
      uVar7 = (uint)*(byte *)((long)key + cVar3) + uVar7 * 0x21;
    }
  }
  uVar7 = uVar7 & self->hashmsk;
  pphVar6 = self->table + uVar7;
  pphVar4 = pphVar6;
  phVar5 = (hashtbl_node_t *)0x0;
  while( true ) {
    __ptr = *pphVar4;
    if (__ptr == (hashtbl_node_t *)0x0) {
      return;
    }
    if ((((__ptr->hash == uVar7) && (__ptr->keylen == len)) && (__ptr->key != (void *)0x0)) &&
       (iVar2 = bcmp(__ptr->key,key,len), iVar2 == 0)) break;
    pphVar4 = &__ptr->next;
    phVar5 = __ptr;
  }
  pphVar4 = &phVar5->next;
  if (*pphVar6 == __ptr) {
    pphVar4 = pphVar6;
  }
  *pphVar4 = __ptr->next;
  if (self->callback != (cf_hashtbl_cb_f)0x0) {
    (*self->callback)(__ptr->value);
  }
  free(__ptr->key);
  free(__ptr);
  self->size = self->size - 1;
  return;
}

Assistant:

cf_void_t cf_hashtbl_set(cf_hashtbl_t* self, const cf_void_t* key, cf_size_t len, cf_void_t* value) {
    hashtbl_node_t* node = CF_NULL_PTR;

    /* clear item */
    if (value == CF_NULL_PTR) {
        hashtbl_remove_node(self, key, len);
        return;
    }

    node = hashtbl_get_node(self, key, len, CF_TRUE);
    if (node) {
        node->value = value;
    }
}